

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void init_stones(void)

{
  uint uVar1;
  long lVar2;
  
  used[0x10] = false;
  used[0x11] = false;
  used[0x12] = false;
  used[0x13] = false;
  used[0x14] = false;
  used[0x15] = false;
  used[0x16] = false;
  used[0x17] = false;
  used[0x18] = false;
  used[0x19] = false;
  used[0] = false;
  used[1] = false;
  used[2] = false;
  used[3] = false;
  used[4] = false;
  used[5] = false;
  used[6] = false;
  used[7] = false;
  used[8] = false;
  used[9] = false;
  used[10] = false;
  used[0xb] = false;
  used[0xc] = false;
  used[0xd] = false;
  used[0xe] = false;
  used[0xf] = false;
  lVar2 = 0;
  do {
    do {
      uVar1 = rnd(0x1a);
    } while (used[uVar1] != false);
    used[uVar1] = true;
    ring_info[lVar2].oi_worth = ring_info[lVar2].oi_worth + stones[uVar1].st_value;
    r_stones[lVar2] = stones[uVar1].st_name;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xe);
  return;
}

Assistant:

void init_stones()
{
    unsigned int i, j;

    for (i = 0; i < NSTONES; i++)
        used[i] = false;
    for (i = 0; i < MAXRINGS; i++)
    {
        do
            j = rnd(NSTONES);
        until (!used[j]);
        used[j] = true;
        r_stones[i] = stones[j].st_name;
        ring_info[i].oi_worth += stones[j].st_value;
    }
}